

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QPixmapCache::Key>_>::moveFromSpan
          (Span<QHashPrivate::Node<QString,_QPixmapCache::Key>_> *this,
          Span<QHashPrivate::Node<QString,_QPixmapCache::Key>_> *fromSpan,size_t fromIndex,size_t to
          )

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  this->offsets[to] = this->nextFree;
  pEVar5 = this->entries;
  bVar3 = this->nextFree;
  this->nextFree = pEVar5[bVar3].storage.data[0];
  bVar4 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar6 = fromSpan->entries;
  uVar7 = *(undefined8 *)pEVar6[bVar4].storage.data;
  uVar8 = *(undefined8 *)(pEVar6[bVar4].storage.data + 8);
  puVar1 = pEVar6[bVar4].storage.data + 0x10;
  uVar9 = *(undefined8 *)(puVar1 + 8);
  puVar2 = pEVar5[bVar3].storage.data + 0x10;
  *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(puVar2 + 8) = uVar9;
  *(undefined8 *)pEVar5[bVar3].storage.data = uVar7;
  *(undefined8 *)(pEVar5[bVar3].storage.data + 8) = uVar8;
  pEVar6[bVar4].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar4;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }